

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v256_intrinsics_c.h
# Opt level: O0

c_v256 * c_v256_pshuffle_8(c_v256 a,c_v256 pattern)

{
  c_v256 a_00;
  c_v256 a_01;
  c_v256 a_02;
  c_v256 a_03;
  c_v256 *in_RDI;
  c_v128 cVar1;
  c_v128 cVar2;
  c_v128 pattern_00;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  undefined8 in_stack_00000018;
  undefined8 in_stack_00000020;
  undefined8 in_stack_00000028;
  undefined8 in_stack_00000030;
  undefined8 in_stack_00000038;
  undefined8 in_stack_00000040;
  
  a_00.u64[1] = in_stack_00000010;
  a_00.u64[0] = in_stack_00000008;
  a_00.u64[2] = in_stack_00000018;
  a_00.u64[3] = in_stack_00000020;
  cVar1 = c_v256_high_v128(a_00);
  a_02.u64[1] = in_stack_00000030;
  a_02.u64[0] = in_stack_00000028;
  a_02.u64[2] = in_stack_00000038;
  a_02.u64[3] = in_stack_00000040;
  cVar2 = c_v256_high_v128(a_02);
  cVar1 = c_v128_shuffle_8(cVar1,cVar2);
  a_01.u64[1] = in_stack_00000010;
  a_01.u64[0] = in_stack_00000008;
  a_01.u64[2] = in_stack_00000018;
  a_01.u64[3] = in_stack_00000020;
  cVar2 = c_v256_low_v128(a_01);
  a_03.u64[1] = in_stack_00000030;
  a_03.u64[0] = in_stack_00000028;
  a_03.u64[2] = in_stack_00000038;
  a_03.u64[3] = in_stack_00000040;
  pattern_00 = c_v256_low_v128(a_03);
  cVar2 = c_v128_shuffle_8(cVar2,pattern_00);
  c_v256_from_v128(in_RDI,cVar1,cVar2);
  return in_RDI;
}

Assistant:

SIMD_INLINE c_v256 c_v256_pshuffle_8(c_v256 a, c_v256 pattern) {
  return c_v256_from_v128(
      c_v128_shuffle_8(c_v256_high_v128(a), c_v256_high_v128(pattern)),
      c_v128_shuffle_8(c_v256_low_v128(a), c_v256_low_v128(pattern)));
}